

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

void store_update(void)

{
  town *ptVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  long lVar4;
  store *psVar5;
  bool bVar6;
  
  if ((player->opts).opt[0x1a] == true) {
    msg("Updating Shops...");
  }
LAB_001c2748:
  do {
    bVar6 = daycount == 0;
    daycount = daycount - 1;
    if (bVar6) {
      daycount = 0;
      if ((player->opts).opt[0x1a] != true) {
        return;
      }
      msg("Done.");
      return;
    }
    for (lVar4 = 0; lVar4 < world->num_towns; lVar4 = lVar4 + 1) {
      psVar5 = (store *)&world->towns[lVar4].stores;
      while (psVar5 = psVar5->next, psVar5 != (store *)0x0) {
        if (psVar5->sidx != store_home_idx) {
          store_maint(psVar5);
        }
      }
    }
    uVar2 = Rand_div((uint)z_info->store_shuffle);
  } while (uVar2 != 0);
  if ((player->opts).opt[0x1a] == true) {
    msg("Shuffling a Shopkeeper...");
  }
  do {
    do {
      uVar2 = Rand_div(world->num_towns);
      ptVar1 = world->towns;
      uVar3 = Rand_div((uint)z_info->store_max);
    } while (uVar3 == store_home_idx);
    psVar5 = (store *)&ptVar1[(int)uVar2].stores;
    while (psVar5 = psVar5->next, psVar5 != (store *)0x0) {
      if (uVar3 == psVar5->sidx) {
        store_shuffle(psVar5);
        goto LAB_001c2748;
      }
    }
  } while( true );
}

Assistant:

void store_update(void)
{
	if (OPT(player, cheat_xtra)) msg("Updating Shops...");
	while (daycount--) {
		int i;
		struct store *s;

		/* Maintain each shop (except home) */
		for (i = 0; i < world->num_towns; i++) {
			struct town *town = &world->towns[i];
			for (s = town->stores; s; s = s->next) {
				/* Skip the home */
				if (store_is_home(s)) continue;

				/* Maintain */
				store_maint(s);
			}
		}

		/* Sometimes, shuffle the shop-keepers */
		if (one_in_(z_info->store_shuffle)) {
			/* Message */
			if (OPT(player, cheat_xtra)) msg("Shuffling a Shopkeeper...");

			/* Pick a random shop in a random town */
			while (1) {
				int m = randint0(world->num_towns);
				struct town *town = &world->towns[m];
				unsigned int n = randint0(z_info->store_max);
				if (n == store_home_idx) continue;
				for (s = town->stores; s; s = s->next) {
					if (n == s->sidx) break;
				}
				if (s) break;
			}

			/* Shuffle it */
			store_shuffle(s);
		}
	}
	daycount = 0;
	if (OPT(player, cheat_xtra)) msg("Done.");
}